

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O2

void __thiscall tli_window_manager::TableBox::print(TableBox *this,Canvas *canvas,int row,int col)

{
  pointer pvVar1;
  pointer ppVar2;
  Box *pBVar3;
  type *box;
  pointer ppVar4;
  vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  *current_row;
  pointer pvVar5;
  
  pvVar1 = (this->table_).
           super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar5 = (this->table_).
                super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
    ppVar2 = (pvVar5->
             super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar4 = (pvVar5->
                  super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1)
    {
      pBVar3 = ppVar4->first;
      if (pBVar3 != (Box *)0x0) {
        (*pBVar3->_vptr_Box[1])
                  (pBVar3,canvas,(ulong)(uint)((ppVar4->second).first + row),
                   (ulong)(uint)((ppVar4->second).second + col));
      }
    }
  }
  return;
}

Assistant:

void TableBox::print(Canvas &canvas, int row, int col) const {
    for (const auto &current_row : table_) {
        for (const auto &[box, pos] : current_row) {
            if (box) {
                box->print(canvas, pos.first + row, pos.second + col);
            }
        }
    }
}